

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_59::InMemoryFile::copy(InMemoryFile *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Exception *pEVar1;
  Waiter *pWVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  Impl *in_RCX;
  Exception *pEVar5;
  ulong in_R8;
  ulong uVar6;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> local_60 [3];
  
  (**(code **)(*(long *)src + 0x10))(local_60,src);
  uVar6 = (long)local_60[0].ptr - (long)in_RCX;
  if (in_RCX <= local_60[0].ptr && uVar6 != 0) {
    if (in_R8 < uVar6) {
      uVar6 = in_R8;
    }
    if (uVar6 != 0) {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_60,&this->impl
                );
      Impl::ensureCapacity(local_60[0].ptr,(size_t)(dst + uVar6));
      lVar4 = (**(code **)(*(long *)src + 0x30))(src);
      pEVar1 = (((Maybe<kj::Own<kj::Exception,_std::nullptr_t>_> *)((long)local_60[0].ptr + 0x18))->
               ptr).ptr;
      pEVar5 = (Exception *)(dst + lVar4);
      if ((Exception *)(dst + lVar4) < pEVar1) {
        pEVar5 = pEVar1;
      }
      pWVar2 = ((Maybe<kj::_::Mutex::Waiter_&> *)&(local_60[0].ptr)->clock)->ptr;
      (((Maybe<kj::Own<kj::Exception,_std::nullptr_t>_> *)((long)local_60[0].ptr + 0x18))->ptr).ptr
           = pEVar5;
      iVar3 = (*(code *)(((pWVar2->next).ptr)->next).ptr)();
      ((local_60[0].ptr)->lastModified).value.value = CONCAT44(extraout_var,iVar3);
      Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked(local_60);
      goto LAB_003b4dfe;
    }
  }
  lVar4 = 0;
LAB_003b4dfe:
  return (int)lVar4;
}

Assistant:

size_t copy(uint64_t offset, const ReadableFile& from,
              uint64_t fromOffset, uint64_t copySize) const override {
    size_t fromFileSize = from.stat().size;
    if (fromFileSize <= fromOffset) return 0;

    // Clamp size to EOF.
    copySize = kj::min(copySize, fromFileSize - fromOffset);
    if (copySize == 0) return 0;

    auto lock = impl.lockExclusive();

    // Allocate space for the copy.
    uint64_t end = offset + copySize;
    lock->ensureCapacity(end);

    // Read directly into our backing store.
    size_t n = from.read(fromOffset, lock->bytes.slice(offset, end));
    lock->size = kj::max(lock->size, offset + n);

    lock->modified();
    return n;
  }